

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefiledeps.cpp
# Opt level: O0

bool __thiscall QMakeSourceFileInfo::findMocs(QMakeSourceFileInfo *this,SourceFile *file)

{
  bool bVar1;
  int iVar2;
  QString *pQVar3;
  ulong uVar4;
  char *pcVar5;
  size_t sVar6;
  QMakeLocalFileName *in_RSI;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  size_t needle_len;
  int interest_1;
  int y_1;
  char *keyword;
  char (*__end8) [19];
  char (*__begin8) [19];
  char (*__range8) [5] [19];
  int interest;
  int y;
  int have_read;
  qint64 fs;
  int extralines_1;
  int matchlen;
  int morelines;
  anon_class_40_5_ae8aebb2 is_ignore;
  anon_class_1_0_00000001 starts_with;
  int extralines;
  int x;
  int line_count;
  QFile f;
  char *buffer;
  int buffer_len;
  bool ignore [5];
  char tag [13];
  QString *in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe80;
  int in_stack_fffffffffffffe84;
  undefined5 in_stack_fffffffffffffe88;
  undefined1 in_stack_fffffffffffffe8d;
  undefined1 in_stack_fffffffffffffe8e;
  byte in_stack_fffffffffffffe8f;
  char *in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffea0;
  int in_stack_fffffffffffffea4;
  char (*in_stack_fffffffffffffea8) [19];
  char (*in_stack_fffffffffffffeb0) [19];
  char (*in_stack_fffffffffffffeb8) [19];
  char (*pacVar7) [19];
  int local_134;
  byte local_101;
  undefined4 local_e4;
  int iVar8;
  int *local_c0;
  int *local_b8;
  char *local_b0;
  undefined1 *local_a8;
  char **local_a0;
  undefined1 local_95;
  int local_94;
  int local_90;
  uint local_8c [9];
  undefined1 local_68 [48];
  undefined8 local_38;
  undefined8 local_30;
  char *local_28;
  int local_20;
  byte local_1a [5];
  char local_15 [13];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(byte *)((long)&in_RSI[1].real_name.d.ptr + 4) >> 3 & 1) == 0) {
    *(undefined1 *)(in_RDI + 3) = 1;
    *(byte *)((long)&in_RSI[1].real_name.d.ptr + 4) =
         *(byte *)((long)&in_RSI[1].real_name.d.ptr + 4) & 0xf7 | 8;
    local_20 = 0;
    local_28 = (char *)0x0;
    local_38 = 0xaaaaaaaaaaaaaaaa;
    local_30 = 0xaaaaaaaaaaaaaaaa;
    (**(code **)*in_RDI)(local_68,in_RDI,in_RSI,1);
    pQVar3 = QMakeLocalFileName::local
                       ((QMakeLocalFileName *)
                        CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
    QFile::QFile((QFile *)&local_38,(QString *)pQVar3);
    QMakeLocalFileName::~QMakeLocalFileName
              ((QMakeLocalFileName *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
    QFlags<QIODeviceBase::OpenModeFlag>::QFlags
              ((QFlags<QIODeviceBase::OpenModeFlag> *)
               CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
               (OpenModeFlag)((ulong)in_stack_fffffffffffffe78 >> 0x20));
    uVar4 = QFile::open((QFlags_conflict *)&local_38);
    if ((uVar4 & 1) == 0) {
      local_101 = 0;
      bVar1 = true;
    }
    else {
      QFile::size();
      local_28 = getBuffer((QMakeSourceFileInfo *)
                           CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                           (int)((ulong)in_stack_fffffffffffffe78 >> 0x20));
      while (iVar2 = QIODevice::read((char *)&local_38,(longlong)(local_28 + local_20)), iVar2 != 0)
      {
        local_20 = iVar2 + local_20;
      }
      bVar1 = false;
    }
    QFile::~QFile((QFile *)&local_38);
    if (!bVar1) {
      if (Option::debug_level != 0) {
        QMakeLocalFileName::local
                  ((QMakeLocalFileName *)
                   CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
        QString::toLatin1(in_stack_fffffffffffffe78);
        pcVar5 = QByteArray::constData((QByteArray *)0x1d0a02);
        debug_msg_internal(2,"findMocs: %s",pcVar5);
        QByteArray::~QByteArray((QByteArray *)0x1d0a25);
      }
      local_8c[0] = 1;
      memset(local_1a,0,5);
      for (local_90 = 0; local_90 < local_20; local_90 = local_90 + 1) {
        local_90 = skipEscapedLineEnds(local_28,local_20,local_90,(int *)local_8c);
        if (local_28[local_90] == '/') {
          local_94 = 0;
          iVar2 = skipEscapedLineEnds(local_28,local_20,local_90 + 1,&local_94);
          if (iVar2 < local_20) {
            if (local_28[iVar2] == '/') {
              local_8c[0] = local_94 + local_8c[0];
              local_90 = iVar2;
              do {
                local_90 = skipEscapedLineEnds(local_28,local_20,local_90 + 1,(int *)local_8c);
                in_stack_fffffffffffffe8f = 0;
                if (local_90 < local_20) {
                  in_stack_fffffffffffffe8e = true;
                  if (local_28[local_90] != '\r') {
                    in_stack_fffffffffffffe8e = local_28[local_90] == '\n';
                  }
                  in_stack_fffffffffffffe8f = in_stack_fffffffffffffe8e ^ 0xff;
                }
              } while ((in_stack_fffffffffffffe8f & 1) != 0);
            }
            else if (local_28[iVar2] == '*') {
              local_8c[0] = local_94 + local_8c[0];
              for (local_90 = skipEscapedLineEnds(local_28,local_20,iVar2 + 1,(int *)local_8c);
                  local_90 < local_20;
                  local_90 = skipEscapedLineEnds(local_28,local_20,local_90 + 1,(int *)local_8c)) {
                if ((local_28[local_90] == 't') || (local_28[local_90] == 'q')) {
                  builtin_strncpy(local_15,"make ignore ",0xd);
                  local_95 = 0xaa;
                  memset(&local_c0,0,0x28);
                  local_c0 = &local_20;
                  local_b8 = &local_90;
                  local_b0 = local_15;
                  local_a8 = &local_95;
                  local_a0 = &local_28;
                  local_134 = 0;
                  in_stack_fffffffffffffeb0 = (char (*) [19])&DAT_003434af;
                  in_stack_fffffffffffffeb8 = findMocs::keywords;
                  while (in_stack_fffffffffffffeb8 != in_stack_fffffffffffffeb0) {
                    pacVar7 = in_stack_fffffffffffffeb8;
                    bVar1 = findMocs::anon_class_40_5_ae8aebb2::operator()
                                      ((anon_class_40_5_ae8aebb2 *)
                                       CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0)
                                       ,in_stack_fffffffffffffe98);
                    if (bVar1) {
                      if (Option::debug_level != 0) {
                        QMakeLocalFileName::real(in_RSI);
                        QString::toLatin1(in_stack_fffffffffffffe78);
                        pcVar5 = QByteArray::constData((QByteArray *)0x1d0df4);
                        debug_msg_internal(2,"Mocgen: %s:%d Found \"q%s%s\"",pcVar5,
                                           (ulong)local_8c[0],local_15,in_stack_fffffffffffffeb8);
                        QByteArray::~QByteArray((QByteArray *)0x1d0e2b);
                      }
                      local_90 = local_90 + 0xc;
                      sVar6 = strlen(*in_stack_fffffffffffffeb8);
                      local_90 = (int)sVar6 + local_90;
                      local_1a[local_134] = 1;
                    }
                    local_134 = local_134 + 1;
                    in_stack_fffffffffffffea8 = in_stack_fffffffffffffeb8;
                    in_stack_fffffffffffffeb8 = pacVar7 + 1;
                  }
                }
                else if (local_28[local_90] == '*') {
                  local_94 = 0;
                  iVar2 = skipEscapedLineEnds(local_28,local_20,local_90 + 1,&local_94);
                  if ((iVar2 < local_20) && (local_28[iVar2] == '/')) {
                    local_8c[0] = local_94 + local_8c[0];
                    local_90 = iVar2;
                    break;
                  }
                }
                else if ((Option::debug_level != 0) &&
                        ((local_28[local_90] == '\r' || (local_28[local_90] == '\n')))) {
                  local_8c[0] = local_8c[0] + 1;
                }
              }
            }
          }
        }
        else if ((local_28[local_90] == '\'') || (local_28[local_90] == '\"')) {
          local_90 = scanPastString(*in_stack_fffffffffffffeb8,
                                    (int)((ulong)in_stack_fffffffffffffeb0 >> 0x20),
                                    (int)in_stack_fffffffffffffeb0,(int *)in_stack_fffffffffffffea8)
          ;
        }
        if (((local_90 < local_20) && (Option::debug_level != 0)) &&
           ((local_28[local_90] == '\r' || (local_28[local_90] == '\n')))) {
          local_8c[0] = local_8c[0] + 1;
        }
        if ((local_90 + 8 < local_20) && (bVar1 = isCWordChar(local_28[local_90]), !bVar1)) {
          iVar2 = 0;
          in_stack_fffffffffffffea4 =
               skipEscapedLineEnds(local_28,local_20,local_90 + 1,(int *)&stack0xffffffffffffff24);
          if (local_28[in_stack_fffffffffffffea4] == 'Q') {
            for (in_stack_fffffffffffffea0 = 0; in_stack_fffffffffffffea0 < 5;
                in_stack_fffffffffffffea0 = in_stack_fffffffffffffea0 + 1) {
              if ((local_1a[in_stack_fffffffffffffea0] & 1) == 0) {
                iVar8 = 0;
                local_e4 = 0;
                in_stack_fffffffffffffe98 =
                     (char *)strlen(findMocs::keywords[in_stack_fffffffffffffea0]);
                in_stack_fffffffffffffe78 = (QString *)&local_e4;
                bVar1 = matchWhileUnsplitting
                                  (in_stack_fffffffffffffe98,(int)((ulong)in_RDI >> 0x20),
                                   (int)in_RDI,
                                   (char *)CONCAT17(in_stack_fffffffffffffe8f,
                                                    CONCAT16(in_stack_fffffffffffffe8e,
                                                             CONCAT15(in_stack_fffffffffffffe8d,
                                                                      in_stack_fffffffffffffe88))),
                                   in_stack_fffffffffffffe84,(int *)in_stack_fffffffffffffe78,
                                   (int *)in_stack_fffffffffffffeb0);
                if (((bVar1) && (in_stack_fffffffffffffea4 + iVar8 < local_20)) &&
                   (bVar1 = isCWordChar(local_28[in_stack_fffffffffffffea4 + iVar8]), !bVar1)) {
                  if ((Option::debug_level != 0) &&
                     (local_28[in_stack_fffffffffffffea4 + iVar8] = '\0', Option::debug_level != 0))
                  {
                    QMakeLocalFileName::real(in_RSI);
                    QString::toLatin1(in_stack_fffffffffffffe78);
                    pcVar5 = QByteArray::constData((QByteArray *)0x1d1237);
                    debug_msg_internal(2,"Mocgen: %s:%d Found MOC symbol %s",pcVar5,
                                       (ulong)(local_8c[0] + iVar2),
                                       local_28 + in_stack_fffffffffffffea4);
                    QByteArray::~QByteArray((QByteArray *)0x1d1278);
                  }
                  *(byte *)((long)&in_RSI[1].real_name.d.ptr + 4) =
                       *(byte *)((long)&in_RSI[1].real_name.d.ptr + 4) & 0xfe | 1;
                  local_101 = 1;
                  goto LAB_001d12cb;
                }
              }
            }
          }
        }
      }
      local_101 = 1;
    }
  }
  else {
    local_101 = 1;
  }
LAB_001d12cb:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(local_101 & 1);
}

Assistant:

bool QMakeSourceFileInfo::findMocs(SourceFile *file)
{
    if(file->moc_checked)
        return true;
    files_changed = true;
    file->moc_checked = true;

    int buffer_len = 0;
    char *buffer = nullptr;
    {
        QFile f(fixPathForFile(file->file, true).local());
        if (!f.open(QIODevice::ReadOnly))
            return false; //shouldn't happen
        const qint64 fs = f.size();
        buffer = getBuffer(fs);
        while (int have_read = f.read(buffer + buffer_len, fs - buffer_len))
            buffer_len += have_read;
    }

    debug_msg(2, "findMocs: %s", file->file.local().toLatin1().constData());
    int line_count = 1;
    enum Keywords {
        Q_OBJECT_Keyword,
        Q_GADGET_Keyword,
        Q_GADGET_EXPORT_Keyword,
        Q_NAMESPACE_Keyword,
        Q_NAMESPACE_EXPORT_Keyword,

        NumKeywords
    };
    static const char keywords[][19] = {
        "Q_OBJECT",
        "Q_GADGET",
        "Q_GADGET_EXPORT",
        "Q_NAMESPACE",
        "Q_NAMESPACE_EXPORT",
    };
    static_assert(std::size(keywords) == NumKeywords);
    bool ignore[NumKeywords] = {};
 /* qmake ignore Q_GADGET */
 /* qmake ignore Q_GADGET_EXPORT */
 /* qmake ignore Q_OBJECT */
 /* qmake ignore Q_NAMESPACE */
 /* qmake ignore Q_NAMESPACE_EXPORT */
    for(int x = 0; x < buffer_len; x++) {
#define SKIP_BSNL(pos) skipEscapedLineEnds(buffer, buffer_len, (pos), &line_count)
        x = SKIP_BSNL(x);
        if (buffer[x] == '/') {
            int extralines = 0;
            int y = skipEscapedLineEnds(buffer, buffer_len, x + 1, &extralines);
            if (buffer_len > y) {
                // If comment, advance to the character that ends it:
                if (buffer[y] == '/') { // C++-style comment
                    line_count += extralines;
                    x = y;
                    do {
                        x = SKIP_BSNL(x + 1);
                    } while (x < buffer_len && !qmake_endOfLine(buffer[x]));

                } else if (buffer[y] == '*') { // C-style comment
                    line_count += extralines;
                    x = SKIP_BSNL(y + 1);
                    for (; x < buffer_len; x = SKIP_BSNL(x + 1)) {
                        if (buffer[x] == 't' || buffer[x] == 'q') { // ignore
                            const char tag[] = "make ignore ";
                            const auto starts_with = [](const char *haystack, const char *needle) {
                                return strncmp(haystack, needle, strlen(needle)) == 0;
                            };
                            const auto is_ignore = [&](const char *keyword) {
                                return buffer_len >= int(x + strlen(tag) + strlen(keyword)) &&
                                        starts_with(buffer + x + 1, tag) &&
                                        starts_with(buffer + x + 1 + strlen(tag), keyword);
                            };
                            int interest = 0;
                            for (const char *keyword : keywords) {
                                if (is_ignore(keyword)){
                                    debug_msg(2, "Mocgen: %s:%d Found \"q%s%s\"",
                                              file->file.real().toLatin1().constData(), line_count,
                                              tag, keyword);
                                    x += static_cast<int>(strlen(tag));
                                    x += static_cast<int>(strlen(keyword));
                                    ignore[interest] = true;
                                }
                                ++interest;
                            }
                        } else if (buffer[x] == '*') {
                            extralines = 0;
                            y = skipEscapedLineEnds(buffer, buffer_len, x + 1, &extralines);
                            if (buffer_len > y && buffer[y] == '/') {
                                line_count += extralines;
                                x = y;
                                break;
                            }
                        } else if (Option::debug_level && qmake_endOfLine(buffer[x])) {
                            ++line_count;
                        }
                    }
                }
                // else: don't update x, buffer[x] is just the division operator.
            }
        } else if (buffer[x] == '\'' || buffer[x] == '"') {
            x = scanPastString(buffer, buffer_len, x, &line_count);
            // Leaves us on closing quote; for loop's x++ steps us past it.
        }

        if (x < buffer_len && Option::debug_level && qmake_endOfLine(buffer[x]))
            ++line_count;
        if (buffer_len > x + 8 && !isCWordChar(buffer[x])) {
            int morelines = 0;
            int y = skipEscapedLineEnds(buffer, buffer_len, x + 1, &morelines);
            if (buffer[y] == 'Q') {
                for (int interest = 0; interest < NumKeywords; ++interest) {
                    if (ignore[interest])
                        continue;

                    int matchlen = 0, extralines = 0;
                    size_t needle_len = strlen(keywords[interest]);
                    Q_ASSERT(needle_len <= INT_MAX);
                    if (matchWhileUnsplitting(buffer, buffer_len, y,
                                              keywords[interest],
                                              static_cast<int>(needle_len),
                                              &matchlen, &extralines)
                        && y + matchlen < buffer_len
                        && !isCWordChar(buffer[y + matchlen])) {
                        if (Option::debug_level) {
                            buffer[y + matchlen] = '\0';
                            debug_msg(2, "Mocgen: %s:%d Found MOC symbol %s",
                                      file->file.real().toLatin1().constData(),
                                      line_count + morelines, buffer + y);
                        }
                        file->mocable = true;
                        return true;
                    }
                }
            }
        }
#undef SKIP_BSNL
    }
    return true;
}